

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_4,_3>,_tcu::Vector<double,_4>,_tcu::Vector<double,_3>_>::call
          (binary<tcu::Matrix<double,_4,_3>,_tcu::Vector<double,_4>,_tcu::Vector<double,_3>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  GLuint GVar4;
  undefined8 *puVar5;
  int row_1;
  undefined8 *puVar6;
  GLdouble *data;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 *puVar10;
  undefined1 auVar11 [16];
  bool bVar13;
  undefined8 uVar14;
  Matrix<double,_4,_3> result;
  undefined8 local_128 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_80 [96];
  long lVar12;
  
  puVar5 = local_128;
  lVar9 = 0;
  GVar4 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  puVar6 = local_128 + 4;
  local_128[10] = 0;
  local_128[0xb] = 0;
  local_128[8] = 0;
  local_128[9] = 0;
  local_128[6] = 0;
  local_128[7] = 0;
  local_128[4] = 0;
  local_128[5] = 0;
  local_128[2] = 0;
  local_128[3] = 0;
  local_128[0] = 0;
  local_128[1] = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    auVar11 = _DAT_019fcc00;
    do {
      bVar13 = SUB164(auVar11 ^ _DAT_019f5ce0,4) == DAT_01a45900._4_4_ &&
               SUB164(auVar11 ^ _DAT_019f5ce0,0) < DAT_01a45900;
      if (bVar13) {
        uVar14 = 0x3ff0000000000000;
        if (lVar9 != lVar8) {
          uVar14 = 0;
        }
        *(undefined8 *)((long)puVar6 + lVar8 + -0x20) = uVar14;
      }
      if (bVar13) {
        uVar14 = 0x3ff0000000000000;
        if (lVar9 + -0x20 != lVar8) {
          uVar14 = 0;
        }
        *(undefined8 *)((long)puVar6 + lVar8) = uVar14;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar8 = lVar8 + 0x40;
    } while (lVar8 != 0x80);
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + 0x20;
    puVar6 = puVar6 + 1;
  } while (lVar7 != 4);
  local_a8 = *argument_src;
  uStack_a0 = *(undefined8 *)((long)argument_src + 8);
  local_98 = *(undefined8 *)((long)argument_src + 0x10);
  uStack_90 = *(undefined8 *)((long)argument_src + 0x18);
  puVar6 = (undefined8 *)((long)argument_src + (ulong)GVar4);
  local_128[0xc] = *puVar6;
  local_128[0xd] = puVar6[1];
  local_128[0xe] = *(undefined8 *)((long)argument_src + (ulong)GVar4 + 0x10);
  puVar10 = local_80;
  (*pcVar1)(puVar10);
  lVar7 = 0;
  do {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)puVar5 + lVar9) = *(undefined8 *)(puVar10 + lVar9);
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x60);
    lVar7 = lVar7 + 1;
    puVar5 = (undefined8 *)((long)puVar5 + 8);
    puVar10 = puVar10 + 8;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    uVar14 = *(undefined8 *)((long)local_128 + lVar7);
    uVar2 = *(undefined8 *)((long)local_128 + lVar7 + 8);
    uVar3 = *(undefined8 *)((long)local_128 + lVar7 + 0x18);
    puVar6 = (undefined8 *)((long)result_dst + lVar7 + 0x10);
    *puVar6 = *(undefined8 *)((long)local_128 + lVar7 + 0x10);
    puVar6[1] = uVar3;
    *(undefined8 *)((long)result_dst + lVar7) = uVar14;
    ((undefined8 *)((long)result_dst + lVar7))[1] = uVar2;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x60);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}